

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_TestParamSet_inv(uint64_t *output,uint64_t *t1)

{
  fe_t_conflict t15;
  fe_t_conflict acc;
  int i;
  uint64_t *in_stack_00000518;
  uint64_t *in_stack_00000520;
  uint64_t *in_stack_00000528;
  uint64_t *in_stack_00000530;
  undefined4 local_14;
  
  fiat_id_GostR3410_2001_TestParamSet_square(in_stack_00000520,in_stack_00000518);
  fiat_id_GostR3410_2001_TestParamSet_mul(in_stack_00000530,in_stack_00000528,in_stack_00000520);
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    fiat_id_GostR3410_2001_TestParamSet_mul(in_stack_00000530,in_stack_00000528,in_stack_00000520);
  }
  fiat_id_GostR3410_2001_TestParamSet_square(in_stack_00000520,in_stack_00000518);
  for (local_14 = 0; local_14 < 0xf4; local_14 = local_14 + 1) {
    fiat_id_GostR3410_2001_TestParamSet_square(in_stack_00000520,in_stack_00000518);
  }
  fiat_id_GostR3410_2001_TestParamSet_mul(in_stack_00000530,in_stack_00000528,in_stack_00000520);
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    fiat_id_GostR3410_2001_TestParamSet_square(in_stack_00000520,in_stack_00000518);
  }
  fiat_id_GostR3410_2001_TestParamSet_mul(in_stack_00000530,in_stack_00000528,in_stack_00000520);
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    fiat_id_GostR3410_2001_TestParamSet_square(in_stack_00000520,in_stack_00000518);
  }
  fiat_id_GostR3410_2001_TestParamSet_mul(in_stack_00000530,in_stack_00000528,in_stack_00000520);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_inv(fe_t output,
                                                    const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t15;

    fiat_id_GostR3410_2001_TestParamSet_square(acc, t1);
    fiat_id_GostR3410_2001_TestParamSet_mul(t15, t1, acc);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_TestParamSet_mul(t15, t15, acc);
    fiat_id_GostR3410_2001_TestParamSet_square(acc, t1);
    for (i = 0; i < 244; i++)
        fiat_id_GostR3410_2001_TestParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_TestParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_TestParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_TestParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_TestParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_TestParamSet_mul(output, acc, t15);
}